

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O2

iter_result_opt * __thiscall
unodb::detail::
basic_inode_256<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::gte_key_byte(iter_result_opt *__return_storage_ptr__,
              basic_inode_256<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
              *this,byte key_byte)

{
  key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
  kVar1;
  uintptr_t uVar2;
  undefined3 in_register_00000011;
  ulong uVar3;
  
  uVar3 = (ulong)CONCAT31(in_register_00000011,key_byte);
  while( true ) {
    if (uVar3 == 0x100) {
      (__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_payload._M_value.node.tagged_ptr = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>
               )._M_payload.
               super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>
               ._M_payload + 8) = 0;
      (__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
      _M_payload._M_value.prefix.u64 = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->
        super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
        _M_payload.
        super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
        _M_engaged = 0;
      return __return_storage_ptr__;
    }
    if ((this->children)._M_elems[uVar3].value.tagged_ptr != 0) break;
    uVar3 = uVar3 + 1;
  }
  uVar2 = basic_node_ptr<unodb::detail::node_header>::tag_ptr((node_header *)this,I256);
  kVar1 = (this->
          super_basic_inode_256_parent<unodb::detail::basic_art_policy<std::span<const_std::byte>,_std::span<const_std::byte>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          ).
          super_basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          .k_prefix;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_payload._M_value.node.tagged_ptr = uVar2;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_payload._M_value.key_byte = (byte)uVar3;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_payload._M_value.child_index = (byte)uVar3;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_payload._M_value.prefix = (key_prefix_snapshot)kVar1;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::node_header>,_true,_true>).
  _M_payload.super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::node_header>_>.
  _M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_256::iter_result_opt
  gte_key_byte(std::byte key_byte) noexcept {
    // loop over the remaining byte values in lexical order.
    for (auto i = static_cast<std::uint64_t>(key_byte);
         i < basic_inode_256::capacity; i++) {
      const auto child_index = static_cast<std::uint8_t>(i);
      if (children[child_index] != nullptr) {
        const auto key = static_cast<std::byte>(i);
        return {{node_ptr{this, node_type::I256}, key, child_index,
                 this->get_key_prefix().get_snapshot()}};
      }
    }
    return parent_class::end_result;
  }